

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O1

void idx2::PrintStats(cstr MetaFileName)

{
  FILE *__s;
  ulong uVar1;
  undefined4 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar3;
  f64 A;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  __s = fopen(MetaFileName,"a");
  fwrite("\n\n---------------- Statistics ----------------\n\n",0x30,1,__s);
  fprintf(__s,"num chunks = %li (bit plane) and %li (exponent) \n",_ZN4idx2L18BitPlaneChunksStatE_3,
          _ZN4idx2L23CompressedExpChunksStatE_3);
  uVar3 = (uint)_ZN4idx2L18BitPlaneChunksStatE_2;
  dVar4 = _ZN4idx2L18BitPlaneChunksStatE_2 / (double)_ZN4idx2L18BitPlaneChunksStatE_3;
  dVar5 = _ZN4idx2L18BitPlaneChunksStatE_4 / (double)_ZN4idx2L18BitPlaneChunksStatE_3 -
          dVar4 * dVar4;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar5;
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar5 = auVar6._0_8_;
  }
  uVar1 = (ulong)(uint)(int)dVar4;
  fprintf(__s,"bit plane chunk: total = %d avg = %d stddev = %d bytes\n",(ulong)uVar3,uVar1,
          (int)dVar5);
  uVar2 = (undefined4)(uVar1 >> 0x20);
  fprintf(__s,"  (metadata) brick deltas = %d bytes\n",
          CONCAT44(extraout_var,(int)_ZN4idx2L15BrickDeltasStatE_2));
  fprintf(__s,"  (metadata) brick sizes = %d bytes\n",
          CONCAT44(extraout_var_00,(int)_ZN4idx2L14BrickSizesStatE_2));
  fprintf(__s,"  (metadata) chunk sizes = %d bytes\n",
          CONCAT44(extraout_var_01,(int)_ZN4idx2L14ChunkSizesStatE_2));
  fprintf(__s,"  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
          CONCAT44(extraout_var_02,(int)_ZN4idx2L30UncompressedChunkAddressesStatE_2),
          CONCAT44(uVar2,(int)_ZN4idx2L28CompressedChunkAddressesStatE_2));
  fwrite("exponent chunk:\n",0x10,1,__s);
  fprintf(__s,"  uncompressed: total = %d bytes\n",
          CONCAT44(extraout_var_03,(int)_ZN4idx2L25UncompressedExpChunksStatE_2));
  uVar3 = (uint)_ZN4idx2L23CompressedExpChunksStatE_2;
  dVar4 = _ZN4idx2L23CompressedExpChunksStatE_2 / (double)_ZN4idx2L23CompressedExpChunksStatE_3;
  dVar5 = _ZN4idx2L23CompressedExpChunksStatE_4 / (double)_ZN4idx2L23CompressedExpChunksStatE_3 -
          dVar4 * dVar4;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar5;
    auVar6 = vsqrtsd_avx(auVar7,auVar7);
    dVar5 = auVar6._0_8_;
  }
  uVar1 = (ulong)(uint)(int)dVar4;
  fprintf(__s,"  compressed: total = %d avg = %d stddev = %d bytes\n",(ulong)uVar3,uVar1,(int)dVar5)
  ;
  uVar2 = (undefined4)(uVar1 >> 0x20);
  fprintf(__s,"  (metadata) chunk sizes = %d bytes\n",
          CONCAT44(extraout_var_04,(int)_ZN4idx2L17ExpChunkSizesStatE_2));
  fprintf(__s,"  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
          CONCAT44(extraout_var_05,(int)_ZN4idx2L33UncompressedExpChunkAddressesStatE_2),
          CONCAT44(uVar2,(int)_ZN4idx2L31CompressedExpChunkAddressesStatE_2));
  fclose(__s);
  return;
}

Assistant:

void
PrintStats(cstr MetaFileName)
{
  FILE* Fp = fopen(MetaFileName, "a");
  fprintf(Fp, "\n\n---------------- Statistics ----------------\n\n");
  fprintf(Fp, "num chunks = %" PRIi64 " (bit plane) and %" PRIi64 " (exponent) \n", BitPlaneChunksStat.Count(), CompressedExpChunksStat.Count());
  fprintf(Fp, "bit plane chunk: total = %d avg = %d stddev = %d bytes\n",
         (int)BitPlaneChunksStat.Sum(),
         (int)BitPlaneChunksStat.Avg(),
         (int)BitPlaneChunksStat.StdDev());
  fprintf(Fp, "  (metadata) brick deltas = %d bytes\n", (int)BrickDeltasStat.Sum());
  fprintf(Fp, "  (metadata) brick sizes = %d bytes\n", (int)BrickSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk sizes = %d bytes\n", (int)ChunkSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
         (int)UncompressedChunkAddressesStat.Sum(), (int)CompressedChunkAddressesStat.Sum());
  fprintf(Fp, "exponent chunk:\n");
  fprintf(Fp, "  uncompressed: total = %d bytes\n", (int)UncompressedExpChunksStat.Sum());
  fprintf(Fp, "  compressed: total = %d avg = %d stddev = %d bytes\n",
         (int) CompressedExpChunksStat.Sum(),
         (int) CompressedExpChunksStat.Avg(),
         (int) CompressedExpChunksStat.StdDev());
  fprintf(Fp, "  (metadata) chunk sizes = %d bytes\n", (int)ExpChunkSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
         (int)UncompressedExpChunkAddressesStat.Sum(), (int)CompressedExpChunkAddressesStat.Sum());
  fclose(Fp);
}